

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O0

int __thiscall cmCursesMainForm::Configure(cmCursesMainForm *this,int noconfigure)

{
  bool bVar1;
  pointer pcVar2;
  pointer this_00;
  string *path;
  cmCursesLongMessageForm *this_01;
  uint local_118;
  uint local_114;
  uint local_108;
  uint local_104;
  int yi;
  int xi;
  cmCursesLongMessageForm *msgs;
  char *title;
  int yy;
  int xx;
  int local_84;
  anon_class_8_1_8991fb9c aStack_80;
  int retVal;
  ProgressCallbackType local_78;
  allocator<char> local_41;
  string local_40;
  int local_1c;
  cmCursesMainForm *pcStack_18;
  int noconfigure_local;
  cmCursesMainForm *this_local;
  
  local_1c = noconfigure;
  pcStack_18 = this;
  ResetOutputs(this);
  if (local_1c == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Configuring",&local_41);
    UpdateProgress(this,&local_40,0.0);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    pcVar2 = std::unique_ptr<cmake,_std::default_delete<cmake>_>::operator->(&this->CMakeInstance);
    aStack_80.this = this;
    std::function<void(std::__cxx11::string_const&,float)>::
    function<cmCursesMainForm::Configure(int)::__0,void>
              ((function<void(std::__cxx11::string_const&,float)> *)&local_78,
               &stack0xffffffffffffff80);
    cmake::SetProgressCallback(pcVar2,&local_78);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float)>
    ::~function(&local_78);
  }
  FillCacheManagerFromUI(this);
  pcVar2 = std::unique_ptr<cmake,_std::default_delete<cmake>_>::operator->(&this->CMakeInstance);
  this_00 = std::unique_ptr<cmake,_std::default_delete<cmake>_>::operator->(&this->CMakeInstance);
  path = cmake::GetHomeOutputDirectory_abi_cxx11_(this_00);
  cmake::SaveCache(pcVar2,path);
  LoadCache(this,(char *)0x0);
  this->OkToGenerate = true;
  if (local_1c == 0) {
    pcVar2 = std::unique_ptr<cmake,_std::default_delete<cmake>_>::operator->(&this->CMakeInstance);
    local_84 = cmake::Configure(pcVar2);
  }
  else {
    pcVar2 = std::unique_ptr<cmake,_std::default_delete<cmake>_>::operator->(&this->CMakeInstance);
    local_84 = cmake::DoPreConfigureChecks(pcVar2);
    this->OkToGenerate = false;
    if (0 < local_84) {
      local_84 = 0;
    }
  }
  pcVar2 = std::unique_ptr<cmake,_std::default_delete<cmake>_>::operator->(&this->CMakeInstance);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float)>
  ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float)>
              *)&yy,(nullptr_t)0x0);
  cmake::SetProgressCallback
            (pcVar2,(function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float)>
                     *)&yy);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float)>
  ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float)>
               *)&yy);
  keypad(_stdscr,1);
  if ((local_84 != 0) || ((this->HasNonStatusOutputs & 1U) != 0)) {
    bVar1 = cmSystemTools::GetErrorOccurredFlag();
    if (bVar1) {
      this->OkToGenerate = false;
    }
    if (_stdscr == 0) {
      local_104 = 0xffffffff;
      local_108 = 0xffffffff;
    }
    else {
      local_104 = (int)*(short *)(_stdscr + 4) + 1;
      local_108 = (int)*(short *)(_stdscr + 6) + 1;
    }
    msgs = (cmCursesLongMessageForm *)anon_var_dwarf_345f5;
    bVar1 = cmSystemTools::GetErrorOccurredFlag();
    if (bVar1) {
      msgs = (cmCursesLongMessageForm *)anon_var_dwarf_3460f;
    }
    this_01 = (cmCursesLongMessageForm *)operator_new(0x68);
    cmCursesLongMessageForm::cmCursesLongMessageForm(this_01,&this->Outputs,(char *)msgs,ScrollDown)
    ;
    cmSystemTools::ResetErrorOccurredFlag();
    cmCursesForm::CurrentForm = (cmCursesForm *)this_01;
    (*(this_01->super_cmCursesForm)._vptr_cmCursesForm[3])
              (this_01,1,1,(ulong)local_108,(ulong)local_104);
    (*(this_01->super_cmCursesForm)._vptr_cmCursesForm[2])();
    if (local_84 == -2) {
      return -2;
    }
  }
  InitializeUI(this);
  if (_stdscr == 0) {
    local_114 = 0xffffffff;
    local_118 = 0xffffffff;
  }
  else {
    local_114 = (int)*(short *)(_stdscr + 4) + 1;
    local_118 = (int)*(short *)(_stdscr + 6) + 1;
  }
  cmCursesForm::CurrentForm = &this->super_cmCursesForm;
  (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])(this,1,1,(ulong)local_118,(ulong)local_114);
  return 0;
}

Assistant:

int cmCursesMainForm::Configure(int noconfigure)
{
  this->ResetOutputs();

  if (noconfigure == 0) {
    this->UpdateProgress("Configuring", 0);
    this->CMakeInstance->SetProgressCallback(
      [this](const std::string& msg, float prog) {
        this->UpdateProgress(msg, prog);
      });
  }

  // always save the current gui values to disk
  this->FillCacheManagerFromUI();
  this->CMakeInstance->SaveCache(
    this->CMakeInstance->GetHomeOutputDirectory());
  this->LoadCache(nullptr);

  // run the generate process
  this->OkToGenerate = true;
  int retVal;
  if (noconfigure) {
    retVal = this->CMakeInstance->DoPreConfigureChecks();
    this->OkToGenerate = false;
    if (retVal > 0) {
      retVal = 0;
    }
  } else {
    retVal = this->CMakeInstance->Configure();
  }
  this->CMakeInstance->SetProgressCallback(nullptr);

  keypad(stdscr, true); /* Use key symbols as KEY_DOWN */

  if (retVal != 0 || this->HasNonStatusOutputs) {
    // see if there was an error
    if (cmSystemTools::GetErrorOccurredFlag()) {
      this->OkToGenerate = false;
    }
    int xx;
    int yy;
    getmaxyx(stdscr, yy, xx);
    const char* title = "Configure produced the following output";
    if (cmSystemTools::GetErrorOccurredFlag()) {
      title = "Configure failed with the following output";
    }
    cmCursesLongMessageForm* msgs = new cmCursesLongMessageForm(
      this->Outputs, title,
      cmCursesLongMessageForm::ScrollBehavior::ScrollDown);
    // reset error condition
    cmSystemTools::ResetErrorOccurredFlag();
    CurrentForm = msgs;
    msgs->Render(1, 1, xx, yy);
    msgs->HandleInput();
    // If they typed the wrong source directory, we report
    // an error and exit
    if (retVal == -2) {
      return retVal;
    }
  }

  this->InitializeUI();
  CurrentForm = this;
  int xi;
  int yi;
  getmaxyx(stdscr, yi, xi);
  this->Render(1, 1, xi, yi);

  return 0;
}